

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

void __thiscall gui::MenuBar::setMenu(MenuBar *this,MenuList *menu,size_t index)

{
  pointer pMVar1;
  Vector2f VVar2;
  int iVar3;
  ulong uVar4;
  
  pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 4) *
          -0x3333333333333333;
  if (index <= uVar4) {
    uVar4 = index;
  }
  sf::String::operator=(&pMVar1[uVar4].name,&menu->name);
  std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>::operator=
            (&pMVar1[uVar4].items,&menu->items);
  VVar2 = menu->menuSize_;
  pMVar1[uVar4].labelPosition_ = menu->labelPosition_;
  pMVar1[uVar4].menuSize_ = VVar2;
  iVar3 = menu->selectedItem_;
  pMVar1[uVar4].labelWidth_ = menu->labelWidth_;
  pMVar1[uVar4].selectedItem_ = iVar3;
  updateMenuBar(this);
  if (this->menuIsOpen_ != false) {
    this->menuIsOpen_ = false;
    Widget::requestRedraw(&this->super_Widget);
    return;
  }
  return;
}

Assistant:

void MenuBar::setMenu(const MenuList& menu, size_t index) {
    menus_[std::min(index, menus_.size())] = menu;
    updateMenuBar();
    selectMenu(selectedMenu_, false);
}